

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O0

void __thiscall xray_re::xr_ogf_v3::bone_io::import_ikdata(bone_io *this,xr_reader *r)

{
  float fVar1;
  xr_reader *r_local;
  bone_io *this_local;
  
  xr_reader::r_sz(r,&(this->super_xr_bone).m_gamemtl);
  xr_reader::r<xray_re::s_bone_shape>(r,&(this->super_xr_bone).m_shape);
  xr_reader::r<xray_re::s_joint_ik_data>(r,&(this->super_xr_bone).m_joint_ik_data);
  (this->super_xr_bone).m_joint_ik_data.friction = 0.0;
  xr_reader::advance(r,0xfffffffffffffffc);
  xr_reader::r_fvector3(r,&(this->super_xr_bone).m_bind_rotate);
  xr_reader::r_fvector3(r,&(this->super_xr_bone).m_bind_offset);
  (this->super_xr_bone).m_bind_length = 0.5;
  fVar1 = xr_reader::r_float(r);
  (this->super_xr_bone).m_mass = fVar1;
  xr_reader::r_fvector3(r,&(this->super_xr_bone).m_center_of_mass);
  return;
}

Assistant:

inline void xr_ogf_v3::bone_io::import_ikdata(xr_reader& r)
{
	r.r_sz(m_gamemtl);
	r.r(m_shape);
	r.r(m_joint_ik_data);

	//friction �� �������� - ������������� ��� � 0 � ������� ��������� ������ �� 4 �����
	m_joint_ik_data.friction = 0.0f;
	r.advance(-4);

	r.r_fvector3(m_bind_rotate);
	r.r_fvector3(m_bind_offset);
	m_bind_length = 0.5f;
	m_mass = r.r_float();
	r.r_fvector3(m_center_of_mass);
}